

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O1

ostream * color::operator<<(ostream *os,shell_command command)

{
  size_t sVar1;
  
  current.command = command.command;
  if (command.command == (char *)0x0) {
    std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(command.command);
    std::__ostream_insert<char,std::char_traits<char>>(os,command.command,sVar1);
  }
  return os;
}

Assistant:

inline std::ostream & operator<<(std::ostream & os, shell_command command) {
	color::current = command;
	return os << command.command;
}